

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O0

size_t str_strlcat(char *dst,char *src,size_t len)

{
  size_t sVar1;
  size_t len_local;
  char *src_local;
  char *dst_local;
  
  sVar1 = strlcat(dst,src,len);
  return sVar1;
}

Assistant:

size_t str_strlcat(char *dst, const char *src, size_t len)
{
#if HAVE_STRLCAT
    return strlcat(dst, src, len);
#else
    register char *d = dst;
    register const char *s = src;
    register size_t n = len;
    size_t dlen;

    /* Find the end of dst and adjust bytes left but don't go past end */
    while (*d != '\0' && n-- != 0)
        d++;
    dlen = d - dst;
    n = len - dlen;

    if (n == 0)
        return (dlen + strlen(s));
    while (*s != '\0') {
        if (n != 1) {
            *d++ = *s;
            n--;
        }
        s++;
    }
    *d = '\0';

    return (dlen + (s - src));    /* count does not include NUL */
#endif
}